

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printResultType
          (TapAssertionPrinter *this,StringRef passOrFail)

{
  ostream *poVar1;
  StringRef passOrFail_local;
  
  passOrFail_local.m_size = passOrFail.m_size;
  passOrFail_local.m_start = passOrFail.m_start;
  if (passOrFail_local.m_size != 0) {
    poVar1 = Catch::operator<<(this->stream,&passOrFail_local);
    poVar1 = std::operator<<(poVar1,' ');
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
    std::operator<<(poVar1," -");
    return;
  }
  return;
}

Assistant:

void printResultType(StringRef passOrFail) const {
                if (!passOrFail.empty()) {
                    stream << passOrFail << ' ' << counter << " -";
                }
            }